

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_sse2.c
# Opt level: O2

void quantize(__m256i *qp,__m256i *c,int16_t *iscan_ptr,int log_scale,tran_low_t *qcoeff,
             tran_low_t *dqcoeff,__m256i *eob)

{
  __m256i alVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  
  alVar1 = *c;
  auVar4 = vpabsd_avx2((undefined1  [32])alVar1);
  auVar5 = vpaddd_avx2(auVar4,(undefined1  [32])*qp);
  auVar6 = vpmuldq_avx2(auVar5,(undefined1  [32])qp[1]);
  auVar5 = vpsrlq_avx2(auVar5,0x20);
  auVar7 = vpsrlq_avx2((undefined1  [32])qp[1],0x20);
  auVar5 = vpmuldq_avx2(auVar5,auVar7);
  auVar6 = vpsrlq_avx2(auVar6,ZEXT416(0x10 - log_scale));
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x10 - log_scale));
  auVar5 = vpsllq_avx2(auVar5,0x20);
  auVar5 = vpor_avx2(auVar5,auVar6);
  auVar4 = vpslld_avx2(auVar4,ZEXT416(log_scale + 1));
  auVar4 = vpcmpgtd_avx2((undefined1  [32])qp[2],auVar4);
  auVar4 = vpandn_avx2(auVar4,auVar5);
  auVar5 = vpmulld_avx2(auVar4,(undefined1  [32])qp[2]);
  auVar5 = vpsrad_avx2(auVar5,ZEXT416((uint)log_scale));
  auVar4 = vpsignd_avx2(auVar4,(undefined1  [32])alVar1);
  auVar5 = vpsignd_avx2(auVar5,(undefined1  [32])alVar1);
  *(undefined1 (*) [32])qcoeff = auVar4;
  *(undefined1 (*) [32])dqcoeff = auVar5;
  auVar2 = vpmovzxwd_avx(*(undefined1 (*) [16])iscan_ptr);
  auVar3 = vpunpckhwd_avx(*(undefined1 (*) [16])iscan_ptr,(undefined1  [16])0x0);
  auVar4._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar4._16_16_ = ZEXT116(1) * auVar3;
  auVar6 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar5 = vpcmpeqd_avx2(auVar5,auVar6);
  auVar4 = vpaddd_avx2(auVar4,auVar5);
  auVar6 = vpcmpeqd_avx2(auVar6,auVar6);
  auVar4 = vpsubd_avx2(auVar4,auVar6);
  auVar4 = vpandn_avx2(auVar5,auVar4);
  alVar1 = (__m256i)vpmaxsd_avx2(auVar4,(undefined1  [32])*eob);
  *eob = alVar1;
  return;
}

Assistant:

static inline void quantize(const int16_t *iscan_ptr,
                            const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                            tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                            const __m128i *round0, const __m128i *round1,
                            const __m128i *quant0, const __m128i *quant1,
                            const __m128i *dequant0, const __m128i *dequant1,
                            const __m128i *thr0, const __m128i *thr1,
                            __m128i *eob) {
  __m128i coeff0, coeff1;
  // Do DC and first 15 AC
  read_coeff(coeff_ptr, n_coeffs, &coeff0, &coeff1);

  // Poor man's sign extract
  const __m128i coeff0_sign = _mm_srai_epi16(coeff0, 15);
  const __m128i coeff1_sign = _mm_srai_epi16(coeff1, 15);
  __m128i qcoeff0 = _mm_xor_si128(coeff0, coeff0_sign);
  __m128i qcoeff1 = _mm_xor_si128(coeff1, coeff1_sign);
  qcoeff0 = _mm_sub_epi16(qcoeff0, coeff0_sign);
  qcoeff1 = _mm_sub_epi16(qcoeff1, coeff1_sign);
  const __m128i mask0 = _mm_or_si128(_mm_cmpgt_epi16(qcoeff0, *thr0),
                                     _mm_cmpeq_epi16(qcoeff0, *thr0));
  const __m128i mask1 = _mm_or_si128(_mm_cmpgt_epi16(qcoeff1, *thr1),
                                     _mm_cmpeq_epi16(qcoeff1, *thr1));
  const int nzflag = _mm_movemask_epi8(mask0) | _mm_movemask_epi8(mask1);

  if (nzflag) {
    qcoeff0 = _mm_adds_epi16(qcoeff0, *round0);
    qcoeff1 = _mm_adds_epi16(qcoeff1, *round1);
    const __m128i qtmp0 = _mm_mulhi_epi16(qcoeff0, *quant0);
    const __m128i qtmp1 = _mm_mulhi_epi16(qcoeff1, *quant1);

    // Reinsert signs
    qcoeff0 = _mm_xor_si128(qtmp0, coeff0_sign);
    qcoeff1 = _mm_xor_si128(qtmp1, coeff1_sign);
    qcoeff0 = _mm_sub_epi16(qcoeff0, coeff0_sign);
    qcoeff1 = _mm_sub_epi16(qcoeff1, coeff1_sign);

    write_qcoeff(&qcoeff0, &qcoeff1, qcoeff_ptr, n_coeffs);

    coeff0 = _mm_mullo_epi16(qcoeff0, *dequant0);
    coeff1 = _mm_mullo_epi16(qcoeff1, *dequant1);

    write_qcoeff(&coeff0, &coeff1, dqcoeff_ptr, n_coeffs);

    const __m128i zero = _mm_setzero_si128();
    // Scan for eob
    const __m128i zero_coeff0 = _mm_cmpeq_epi16(coeff0, zero);
    const __m128i zero_coeff1 = _mm_cmpeq_epi16(coeff1, zero);
    const __m128i nzero_coeff0 = _mm_cmpeq_epi16(zero_coeff0, zero);
    const __m128i nzero_coeff1 = _mm_cmpeq_epi16(zero_coeff1, zero);
    const __m128i iscan0 =
        _mm_load_si128((const __m128i *)(iscan_ptr + n_coeffs));
    const __m128i iscan1 =
        _mm_load_si128((const __m128i *)(iscan_ptr + n_coeffs) + 1);
    // Add one to convert from indices to counts
    const __m128i iscan0_nz = _mm_sub_epi16(iscan0, nzero_coeff0);
    const __m128i iscan1_nz = _mm_sub_epi16(iscan1, nzero_coeff1);
    const __m128i eob0 = _mm_and_si128(iscan0_nz, nzero_coeff0);
    const __m128i eob1 = _mm_and_si128(iscan1_nz, nzero_coeff1);
    const __m128i eob2 = _mm_max_epi16(eob0, eob1);
    *eob = _mm_max_epi16(*eob, eob2);
  } else {
    write_zero(qcoeff_ptr, n_coeffs);
    write_zero(dqcoeff_ptr, n_coeffs);
  }
}